

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interp.cc
# Opt level: O3

RunResult __thiscall
wabt::interp::Thread::Load<signed_char>(Thread *this,Instr instr,char *out,Ptr *out_trap)

{
  ulong uVar1;
  pointer puVar2;
  Store *this_00;
  RunResult RVar3;
  Value VVar4;
  RefPtr<wabt::interp::Memory> local_80;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_68;
  RefPtr<wabt::interp::Trap> local_48;
  
  RefPtr<wabt::interp::Memory>::RefPtr
            (&local_80,this->store_,
             (Ref)(this->inst_->memories_).
                  super__Vector_base<wabt::interp::Ref,_std::allocator<wabt::interp::Ref>_>._M_impl.
                  super__Vector_impl_data._M_start[instr.field_2.imm_u32].index);
  VVar4 = Pop(this);
  uVar1 = (ulong)VVar4.i32_ + (ulong)instr.field_2.imm_u32x2.snd;
  puVar2 = ((local_80.obj_)->data_).
           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (uVar1 < (ulong)((long)((local_80.obj_)->data_).
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_finish - (long)puVar2)) {
    *out = puVar2[(ulong)instr.field_2.imm_u32x2.snd + (ulong)VVar4.i32_];
    RVar3 = Ok;
  }
  else {
    this_00 = this->store_;
    StringPrintf_abi_cxx11_
              (&local_68,"out of bounds memory access: access at %lu+%zd >= max value %u",uVar1,1);
    Store::
    Alloc<wabt::interp::Trap,wabt::interp::Store&,std::__cxx11::string_const&,std::vector<wabt::interp::Frame,std::allocator<wabt::interp::Frame>>const&>
              (&local_48,this_00,this_00,&local_68,&this->frames_);
    out_trap->obj_ = local_48.obj_;
    out_trap->store_ = local_48.store_;
    out_trap->root_index_ = local_48.root_index_;
    local_48.obj_ = (Trap *)0x0;
    local_48.store_ = (Store *)0x0;
    local_48.root_index_ = 0;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_68._M_dataplus._M_p != &local_68.field_2) {
      operator_delete(local_68._M_dataplus._M_p);
    }
    RVar3 = Trap;
    if (local_80.obj_ == (Memory *)0x0) {
      return Trap;
    }
  }
  FreeList<wabt::interp::Ref>::Delete(&(local_80.store_)->roots_,local_80.root_index_);
  return RVar3;
}

Assistant:

RunResult Thread::Load(Instr instr, T* out, Trap::Ptr* out_trap) {
  Memory::Ptr memory{store_, inst_->memories()[instr.imm_u32x2.fst]};
  u32 offset = Pop<u32>();
  TRAP_IF(Failed(memory->Load(offset, instr.imm_u32x2.snd, out)),
          StringPrintf("out of bounds memory access: access at %" PRIu64
                       "+%" PRIzd " >= max value %u",
                       u64{offset} + instr.imm_u32x2.snd, sizeof(T),
                       memory->ByteSize()));
  return RunResult::Ok;
}